

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O3

RuleBuilder * __thiscall Potassco::RuleBuilder::weaken(RuleBuilder *this,Body_t to,bool w)

{
  int iVar1;
  uint *puVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  int *piVar6;
  undefined4 *puVar7;
  int iVar8;
  uint uVar9;
  
  puVar2 = (uint *)(this->mem_).beg_;
  uVar9 = puVar2[3];
  if (uVar9 >> 0x1e != to.val_ && 0x3fffffff < uVar9) {
    puVar4 = (undefined4 *)MemoryRegion::operator[](&this->mem_,(ulong)(uVar9 & 0x3fffffff));
    puVar5 = (undefined4 *)
             MemoryRegion::operator[](&this->mem_,(ulong)*(uint *)((long)(this->mem_).beg_ + 0x10));
    if (to.val_ == Normal) {
      uVar9 = (puVar2[3] & 0x3fffffff) - 4;
      puVar2[4] = uVar9;
      puVar2[3] = uVar9 & 0x3fffffff;
      for (; puVar4 != puVar5; puVar4 = puVar4 + 2) {
        puVar7 = (undefined4 *)MemoryRegion::operator[](&this->mem_,(ulong)uVar9);
        *puVar7 = *puVar4;
        uVar9 = uVar9 + 4;
      }
      puVar2[4] = uVar9;
      if (uVar9 < puVar2[2]) {
        uVar9 = puVar2[2];
      }
      *puVar2 = *puVar2 & 0x80000000 | uVar9 & 0x7fffffff;
    }
    else if (((to.val_ == Count) && (w)) && (puVar4 != puVar5)) {
      piVar6 = (int *)MemoryRegion::operator[]
                                (&this->mem_,
                                 (ulong)(*(uint *)((long)(this->mem_).beg_ + 0xc) & 0x3fffffff) - 4)
      ;
      iVar1 = *piVar6;
      iVar8 = puVar4[1];
      do {
        iVar3 = puVar4[1];
        if (iVar8 < (int)puVar4[1]) {
          iVar3 = iVar8;
        }
        iVar8 = iVar3;
        puVar4[1] = 1;
        puVar4 = puVar4 + 2;
      } while (puVar4 != puVar5);
      setBound(this,(iVar1 + iVar8 + -1) / iVar8);
    }
    puVar2[3] = puVar2[3] & 0x3fffffff | to.val_ << 0x1e;
  }
  return this;
}

Assistant:

RuleBuilder& RuleBuilder::weaken(Body_t to, bool w) {
	Rule* r = rule_();
	if (r->body.type == Body_t::Normal || r->body.type == to) { return *this; }
	WeightLit_t* bIt = wlits_begin(), *bEnd = wlits_end();
	if (to == Body_t::Normal) {
		uint32_t i = r->body.mbeg - sizeof(Weight_t);
		r->body.init(i, 0);
		for (; bIt != bEnd; ++bIt, i += sizeof(Lit_t)) {
			new (mem_[i])Lit_t(bIt->lit);
		}
		r->body.mend = i;
		r->top = std::max(r->head.mend, r->body.mend);
	}
	else if (to == Body_t::Count && w && bIt != bEnd) {
		Weight_t bnd = *bound_(), min = bIt->weight;
		for (; bIt != bEnd; ++bIt) {
			if (min > bIt->weight) { min = bIt->weight; }
			bIt->weight = 1;
		}
		setBound((bnd+(min-1))/min);
	}
	r->body.type = to;
	return *this;
}